

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O2

string * __thiscall json::array::dump_abi_cxx11_(string *__return_storage_ptr__,array *this)

{
  char cVar1;
  pointer ppvVar2;
  string asStack_48 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar1);
  for (ppvVar2 = (this->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppvVar2 !=
      (this->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar2 = ppvVar2 + 1) {
    if (ppvVar2 !=
        (this->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__cxx11::string::push_back(cVar1);
    }
    (*(*ppvVar2)->_vptr_value[3])(asStack_48);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(asStack_48);
  }
  std::__cxx11::string::push_back(cVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string json::array::dump () const
{
  std::string output;
  output += '[';

  for (auto i = _data.begin (); i != _data.end (); ++i)
  {
    if (i != _data.begin ())
      output += ',';

    output += (*i)->dump ();
  }

  output += ']';
  return output;
}